

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_realpath(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  char *pcVar1;
  int err;
  char *res;
  char buf [4096];
  char *path;
  undefined4 in_stack_ffffffffffffefa8;
  undefined4 in_stack_ffffffffffffefac;
  int64_t in_stack_ffffffffffffefb0;
  char in_stack_ffffffffffffefb8;
  undefined7 in_stack_ffffffffffffefb9;
  undefined4 in_stack_ffffffffffffefc0;
  int in_stack_ffffffffffffefc4;
  char *in_stack_ffffffffffffefc8;
  JSContext *in_stack_ffffffffffffefd0;
  JSValueUnion local_10;
  int64_t local_8;
  
  val1.u._4_4_ = in_stack_ffffffffffffefac;
  val1.u.int32 = in_stack_ffffffffffffefa8;
  val1.tag = in_stack_ffffffffffffefb0;
  pcVar1 = JS_ToCString((JSContext *)0x11717a,val1);
  if (pcVar1 == (char *)0x0) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  else {
    pcVar1 = realpath(pcVar1,&stack0xffffffffffffefb8);
    JS_FreeCString((JSContext *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                   (char *)CONCAT71(in_stack_ffffffffffffefb9,in_stack_ffffffffffffefb8));
    if (pcVar1 == (char *)0x0) {
      __errno_location();
    }
    _local_10 = make_string_error(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                                  in_stack_ffffffffffffefc4);
  }
  return _local_10;
}

Assistant:

static JSValue js_os_realpath(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    const char *path;
    char buf[PATH_MAX], *res;
    int err;

    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
    res = realpath(path, buf);
    JS_FreeCString(ctx, path);
    if (!res) {
        buf[0] = '\0';
        err = errno;
    } else {
        err = 0;
    }
    return make_string_error(ctx, buf, err);
}